

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

natwm_error client_handle_map_notify(natwm_state *state,xcb_window_t window)

{
  client_state cVar1;
  theme *ptVar2;
  workspace *workspace;
  client *client;
  uint16_t previous_border_width;
  natwm_error nVar3;
  long lVar4;
  uint16_t *puVar5;
  
  workspace = workspace_list_find_window_workspace(state->workspace_list,window);
  nVar3 = NO_ERROR;
  if (workspace != (workspace *)0x0) {
    client = workspace_find_window_client(workspace,window);
    if (client == (client *)0x0) {
      nVar3 = NOT_FOUND_ERROR;
    }
    else {
      cVar1 = client->state;
      if (((cVar1 & CLIENT_OFF_SCREEN) != 0) && (workspace->is_visible == true)) {
        if ((client->is_focused == true) && (workspace->is_focused == true)) {
          if (client->is_fullscreen == false) {
            ptVar2 = state->workspace_list->theme;
            if ((cVar1 & CLIENT_URGENT) == 0) {
              lVar4 = 6;
              if ((cVar1 & CLIENT_STICKY) == 0) {
                lVar4 = 0;
              }
              puVar5 = (uint16_t *)((long)&ptVar2->border_width->unfocused + lVar4);
            }
            else {
              puVar5 = &ptVar2->border_width->urgent;
            }
            previous_border_width = *puVar5;
          }
          else {
            previous_border_width = 0;
          }
          client->state = cVar1 & 0xf7;
          update_theme(state,client,previous_border_width);
        }
        else {
          client->state = cVar1 & 0xf7;
        }
      }
    }
  }
  return nVar3;
}

Assistant:

enum natwm_error client_handle_map_notify(const struct natwm_state *state, xcb_window_t window)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, window);

        if (workspace == NULL) {
                // We do not have this window in our registry
                return NO_ERROR;
        }

        struct client *client = workspace_find_window_client(workspace, window);

        if (client == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (!(client->state & CLIENT_OFF_SCREEN) || !workspace->is_visible) {
                return NO_ERROR;
        }

        if (client->is_focused && workspace->is_focused) {
                // We need to get the previous border_width before removing
                // CLIENT_OFF_SCREEN
                uint16_t border_width
                        = client_get_active_border_width(state->workspace_list->theme, client);

                client->state &= (uint8_t)~CLIENT_OFF_SCREEN;

                update_theme(state, client, border_width);
        } else {
                client->state &= (uint8_t)~CLIENT_OFF_SCREEN;
        }

        return NO_ERROR;
}